

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_felippa_rule.cpp
# Opt level: O0

double triangle_unit_monomial(int *expon)

{
  double local_20;
  double value;
  int k;
  int i;
  int *expon_local;
  
  local_20 = 1.0;
  value._0_4_ = *expon;
  for (value._4_4_ = 1; value._4_4_ <= expon[1]; value._4_4_ = value._4_4_ + 1) {
    value._0_4_ = value._0_4_ + 1;
    local_20 = (local_20 * (double)value._4_4_) / (double)value._0_4_;
  }
  return (local_20 / (double)(value._0_4_ + 1)) / (double)(value._0_4_ + 2);
}

Assistant:

double triangle_unit_monomial ( int expon[2] )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE_UNIT_MONOMIAL integrates a monomial over the unit triangle.
//
//  Discussion:
//
//    This routine integrates a monomial of the form
//
//      product ( 1 <= dim <= 2 ) x(dim)^expon(dim)
//
//    where the exponents are nonnegative integers.  Note that
//    if the combination 0^0 is encountered, it should be treated
//    as 1.
//
//    Integral ( over unit triangle ) x^m y^n dx dy = m! * n! / ( m + n + 2 )!
//
//    The integration region is:
//
//      0 <= X
//      0 <= Y
//      X + Y <= 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 April 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int EXPON[2], the exponents.
//
//    Output, double TRIANGLE_UNIT_MONOMIAL, the integral of the monomial.
//
{
  int i;
  int k;
  double value;
//
//  The first computation ends with VALUE = 1.0;
//
  value = 1.0;

// k = 0;
//
//  The first loop simply computes 1 so we short circuit it!
//
// for ( i = 1; i <= expon[0]; i++ )
// {
//   k = k + 1;
//   value = value * double( i ) / double( k );
// }

  k = expon[0];

  for ( i = 1; i <= expon[1]; i++ )
  {
    k = k + 1;
    value = value * double( i ) / double( k );
  }

  k = k + 1;
  value = value / double( k );

  k = k + 1;
  value = value / double( k );

  return value;
}